

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledImage.cpp
# Opt level: O1

void __thiscall
Rml::DecoratorTiledImageInstancer::~DecoratorTiledImageInstancer(DecoratorTiledImageInstancer *this)

{
  pointer pTVar1;
  
  (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
       (_func_int **)&PTR__DecoratorTiledInstancer_003351d8;
  pTVar1 = (this->super_DecoratorTiledInstancer).tile_property_ids.
           super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)(this->super_DecoratorTiledInstancer).tile_property_ids.
                                 super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar1);
  }
  DecoratorInstancer::~DecoratorInstancer((DecoratorInstancer *)this);
  return;
}

Assistant:

DecoratorTiledImageInstancer::~DecoratorTiledImageInstancer() {}